

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_gfx_clear_color(uchar r,uchar g,uchar b,uchar a)

{
  undefined3 in_register_00000009;
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  undefined3 in_register_00000039;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.ClearColor)
            ((float)CONCAT31(in_register_00000039,r) / 255.0,
             (float)CONCAT31(in_register_00000031,g) / 255.0,
             (float)CONCAT31(in_register_00000011,b) / 255.0,
             (float)CONCAT31(in_register_00000009,a) / 255.0);
  return;
}

Assistant:

RF_API void rf_gfx_clear_color(unsigned char r, unsigned char g, unsigned char b, unsigned char a)
{
    // rf_color values clamp to 0.0f(0) and 1.0f(255)
    float cr = (float)r/255;
    float cg = (float)g/255;
    float cb = (float)b/255;
    float ca = (float)a/255;

    rf_gl.ClearColor(cr, cg, cb, ca);
}